

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O2

void __thiscall dynamicgraph::Signal<double,_int>::~Signal(Signal<double,_int> *this)

{
  (this->super_SignalBase<int>)._vptr_SignalBase = (_func_int **)&PTR__Signal_0012ef58;
  boost::function2<double_&,_double_&,_int>::~function2(&this->Tfunction);
  SignalBase<int>::~SignalBase(&this->super_SignalBase<int>);
  return;
}

Assistant:

virtual ~Signal() {}